

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

ItemFlags __thiscall QTableModel::flags(QTableModel *this,QModelIndex *index)

{
  long lVar1;
  bool bVar2;
  QTableWidgetItem *pQVar3;
  QModelIndex *in_RSI;
  QTableModel *in_RDI;
  long in_FS_OFFSET;
  QTableWidgetItem *itm;
  ItemFlag in_stack_ffffffffffffffbc;
  QTableModel *this_00;
  undefined4 local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar2 = QModelIndex::isValid((QModelIndex *)in_RDI);
  if (bVar2) {
    pQVar3 = item(this_00,in_RSI);
    if (pQVar3 == (QTableWidgetItem *)0x0) {
      Qt::operator|((enum_type)((ulong)in_RDI >> 0x20),(enum_type)in_RDI);
      QFlags<Qt::ItemFlag>::operator|((QFlags<Qt::ItemFlag> *)in_RDI,in_stack_ffffffffffffffbc);
      QFlags<Qt::ItemFlag>::operator|((QFlags<Qt::ItemFlag> *)in_RDI,in_stack_ffffffffffffffbc);
      QFlags<Qt::ItemFlag>::operator|((QFlags<Qt::ItemFlag> *)in_RDI,in_stack_ffffffffffffffbc);
      local_c = (Int)QFlags<Qt::ItemFlag>::operator|
                               ((QFlags<Qt::ItemFlag> *)in_RDI,in_stack_ffffffffffffffbc);
    }
    else {
      local_c = (Int)QTableWidgetItem::flags((QTableWidgetItem *)in_RDI);
    }
  }
  else {
    QFlags<Qt::ItemFlag>::QFlags((QFlags<Qt::ItemFlag> *)in_RDI,in_stack_ffffffffffffffbc);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QFlagsStorageHelper<Qt::ItemFlag,_4>)(QFlagsStorageHelper<Qt::ItemFlag,_4>)local_c;
  }
  __stack_chk_fail();
}

Assistant:

Qt::ItemFlags QTableModel::flags(const QModelIndex &index) const
{
    if (!index.isValid())
        return Qt::ItemIsDropEnabled;
    if (QTableWidgetItem *itm = item(index))
        return itm->flags();
    return (Qt::ItemIsEditable
            |Qt::ItemIsSelectable
            |Qt::ItemIsUserCheckable
            |Qt::ItemIsEnabled
            |Qt::ItemIsDragEnabled
            |Qt::ItemIsDropEnabled);
}